

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppLayout.cpp
# Opt level: O2

void __thiscall cursespp::AppLayout::Initialize(AppLayout *this)

{
  __shared_ptr<cursespp::IWindow,(__gnu_cxx::_Lock_policy)2> a_Stack_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  __shared_ptr<cursespp::ShortcutsWindow,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  std::make_shared<cursespp::ShortcutsWindow>();
  std::__shared_ptr<cursespp::ShortcutsWindow,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->shortcuts).
              super___shared_ptr<cursespp::ShortcutsWindow,_(__gnu_cxx::_Lock_policy)2>,&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  std::__shared_ptr<cursespp::IWindow,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cursespp::ShortcutsWindow,void>
            (a_Stack_38,
             &(this->shortcuts).
              super___shared_ptr<cursespp::ShortcutsWindow,_(__gnu_cxx::_Lock_policy)2>);
  (*(this->super_LayoutBase).super_Window.super_IWindow.super_IOrderable._vptr_IOrderable[0x46])
            (this,a_Stack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  return;
}

Assistant:

void AppLayout::Initialize() {
    this->shortcuts = std::make_shared<ShortcutsWindow>();
    this->AddWindow(this->shortcuts);

#if ENABLE_DEMO_MODE
    this->hotkey.reset(new TextLabel());
    this->hotkey->SetContentColor(Color::Footer);
    this->hotkey->SetText("keypress: <none>", text::AlignCenter);
    this->AddWindow(this->hotkey);
#endif
}